

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_ACES.cpp
# Opt level: O0

ACES * __thiscall
AS_02::ACES::CreateTargetFrameAssetId(ACES *this,UUID *rID,string *target_frame_file)

{
  int iVar1;
  size_t __size;
  uint *puVar2;
  fsize_t size;
  UUID local_160;
  Result_t local_140 [104];
  uint *local_d8;
  byte_t *read_buffer;
  undefined1 local_51;
  FileReader local_50 [8];
  FileReader reader;
  string *target_frame_file_local;
  UUID *rID_local;
  Result_t *result;
  
  Kumu::FileReader::FileReader(local_50);
  local_51 = 0;
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
  Kumu::FileReader::OpenRead((string *)&read_buffer);
  Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&read_buffer);
  Kumu::Result_t::~Result_t((Result_t *)&read_buffer);
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar1) {
    __size = Kumu::FileReader::Size();
    puVar2 = (uint *)malloc(__size);
    local_d8 = puVar2;
    if (puVar2 == (uint *)0x0) {
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)Kumu::RESULT_FAIL);
    }
    else {
      Kumu::FileReader::Size();
      Kumu::FileReader::Read((uchar *)local_140,(uint)local_50,puVar2);
      Kumu::Result_t::operator=((Result_t *)this,local_140);
      Kumu::Result_t::~Result_t(local_140);
      puVar2 = local_d8;
      size = Kumu::FileReader::Size();
      create_4122_type5_id(&local_160,(byte_t *)puVar2,size,s_ns_id_target_frame_prefix);
      Kumu::UUID::operator=(rID,&local_160);
      Kumu::UUID::~UUID(&local_160);
      free(local_d8);
    }
  }
  local_51 = 1;
  Kumu::FileReader::~FileReader(local_50);
  return this;
}

Assistant:

AS_02::Result_t
AS_02::ACES::CreateTargetFrameAssetId(Kumu::UUID& rID, const std::string& target_frame_file)
{
  Kumu::FileReader reader;
  Result_t result = Kumu::RESULT_OK;
  result = reader.OpenRead(target_frame_file);
  if (KM_SUCCESS(result))
  {
    byte_t* read_buffer = (byte_t*)malloc(reader.Size());
    if (read_buffer)
    {
      result = reader.Read(read_buffer, reader.Size());
      rID = AS_02::ACES::create_4122_type5_id(read_buffer, reader.Size(), s_ns_id_target_frame_prefix);
      free(read_buffer);
    } else result = Kumu::RESULT_FAIL;
  }
  return result;
}